

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
TwoValuesWithHashCollision_LeafLevelTenCollision_Test::TestBody
          (TwoValuesWithHashCollision_LeafLevelTenCollision_Test *this)

{
  database *db;
  test_trie *ptVar1;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar2;
  uint generation;
  index_pointer *piVar3;
  typed_address<pstore::index::details::internal_node> tVar4;
  pointer *__ptr;
  index_pointer iVar5;
  char *pcVar6;
  char *in_R9;
  internal_node *piVar7;
  AssertHelper local_388;
  AssertionResult gtest_ar;
  shared_ptr<const_pstore::index::details::internal_node> level1_internal;
  AssertionResult gtest_ar_;
  AssertHelper local_340;
  shared_ptr<const_pstore::index::details::internal_node> level2_internal;
  AssertionResult gtest_ar__2;
  shared_ptr<const_pstore::index::details::internal_node> level7_internal;
  shared_ptr<const_pstore::index::details::internal_node> level6_internal;
  shared_ptr<const_pstore::index::details::internal_node> level10_internal;
  shared_ptr<const_pstore::index::details::internal_node> level5_internal;
  shared_ptr<const_pstore::index::details::internal_node> level9_internal;
  shared_ptr<const_pstore::index::details::internal_node> level8_internal;
  shared_ptr<const_pstore::index::details::internal_node> level4_internal;
  shared_ptr<const_pstore::index::details::internal_node> level3_internal;
  index_pointer root;
  index_pointer level10;
  index_pointer level9;
  index_pointer level8;
  index_pointer level7;
  index_pointer level6;
  index_pointer level5;
  index_pointer level4;
  index_pointer level3;
  index_pointer level2;
  index_pointer level1;
  transaction_type t1;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_208;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_110;
  
  db = &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.db_;
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&gtest_ar,
             (mutex_type *)
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              field_0x10);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&t1,db,(unique_lock<mock_mutex> *)&gtest_ar);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&gtest_ar);
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&gtest_ar,"e",(allocator *)&gtest_ar_);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign
            (&local_110,ptVar1,&t1,(string *)&gtest_ar);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&local_110.first.pos_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&gtest_ar,"f",(allocator *)&gtest_ar_);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign
            (&local_208,ptVar1,&t1,(string *)&gtest_ar);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&local_208.first.pos_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&gtest_ar,"e",(allocator *)&level1_internal);
  bVar2 = anon_unknown.dwarf_13be9a::GenericIndexFixture::is_found
                    ((GenericIndexFixture *)this,ptVar1,(string *)&gtest_ar);
  gtest_ar_.success_ = bVar2;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&level1_internal);
    std::operator<<((ostream *)
                    (CONCAT44(level1_internal.
                              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              level1_internal.
                              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_4_) + 0x10),"key \"e\" should be present in the index");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"this->is_found (*index_, \"e\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&level2_internal,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3dd,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&level2_internal,(Message *)&level1_internal);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&level2_internal);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(level1_internal.
                         super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._4_4_,
                         level1_internal.
                         super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(level1_internal.
                                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._4_4_,
                                     level1_internal.
                                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar5 = *(index_pointer *)
           &(this->super_TwoValuesWithHashCollision).index_._M_t.
            super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
  ;
  std::__cxx11::string::string((string *)&gtest_ar,"f",(allocator *)&level1_internal);
  bVar2 = anon_unknown.dwarf_13be9a::GenericIndexFixture::is_found
                    ((GenericIndexFixture *)this,(test_trie *)iVar5.internal_,(string *)&gtest_ar);
  gtest_ar_.success_ = bVar2;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&level1_internal);
    std::operator<<((ostream *)
                    (CONCAT44(level1_internal.
                              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              level1_internal.
                              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._0_4_) + 0x10),"key \"f\" should be present in the index");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"this->is_found (*index_, \"f\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&level2_internal,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3de,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    iVar5.internal_ = (internal_node *)&level1_internal;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&level2_internal,(Message *)iVar5.internal_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&level2_internal);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(level1_internal.
                         super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._4_4_,
                         level1_internal.
                         super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(level1_internal.
                                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._4_4_,
                                     level1_internal.
                                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  piVar7 = (((this->super_TwoValuesWithHashCollision).index_._M_t.
             super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .
             super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
            ._M_head_impl)->root_).internal_;
  anon_unknown.dwarf_13be9a::GenericIndexFixture::check_is_heap_internal_node
            ((GenericIndexFixture *)piVar7,iVar5);
  piVar7 = (internal_node *)((ulong)piVar7 & 0xfffffffffffffffc);
  gtest_ar_._0_8_ = piVar7->bitmap_;
  level1_internal.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"root_internal->get_bitmap ()","0b1U",(unsigned_long *)&gtest_ar_
             ,(uint *)&level1_internal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&level1_internal,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3e4,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&level1_internal,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&level1_internal);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  piVar3 = pstore::index::details::internal_node::operator[](piVar7,0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar7 = piVar3->internal_;
  gtest_ar_._0_8_ = ((internal_node *)((ulong)piVar7 & 0xfffffffffffffffc))->bitmap_;
  level1_internal.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_4_ = 0x20;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"level5_internal->get_bitmap ()","0b100000U",
             (unsigned_long *)&gtest_ar_,(uint *)&level1_internal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&level1_internal,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3eb,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&level1_internal,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&level1_internal);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar7 & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc),0);
  piVar7 = (internal_node *)((ulong)piVar3->internal_ & 0xfffffffffffffffc);
  gtest_ar_._0_8_ = piVar7->bitmap_;
  level1_internal.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_4_ = 0x9000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"level10_internal->get_bitmap ()","0b1001000000000000U",
             (unsigned_long *)&gtest_ar_,(uint *)&level1_internal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&level1_internal,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3f2,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&level1_internal,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&level1_internal);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  iVar5.internal_ = (internal_node *)0x0;
  piVar3 = pstore::index::details::internal_node::operator[](piVar7,0);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)piVar3->internal_,iVar5);
  iVar5 = (index_pointer)0x1;
  piVar3 = pstore::index::details::internal_node::operator[](piVar7,1);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)piVar3->internal_,iVar5);
  this_00 = (this->super_TwoValuesWithHashCollision).index_._M_t.
            super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
            ._M_head_impl;
  generation = pstore::database::get_current_revision(db);
  iVar5.internal_ = (internal_node *)&t1;
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flush(this_00,(transaction_base *)iVar5.internal_,generation);
  root = ((this->super_TwoValuesWithHashCollision).index_._M_t.
          super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
         ._M_head_impl)->root_;
  anon_unknown.dwarf_13be9a::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)root.internal_,iVar5);
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&root.addr_);
  pstore::index::details::internal_node::read_node((internal_node *)&gtest_ar_,db,tVar4);
  piVar3 = pstore::index::details::internal_node::operator[]((internal_node *)gtest_ar_._0_8_,0);
  level1 = *piVar3;
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&level1.addr_);
  pstore::index::details::internal_node::read_node((internal_node *)&level1_internal,db,tVar4);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      CONCAT44(level1_internal.
                               super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._4_4_,
                               level1_internal.
                               super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._0_4_),0);
  level2 = *piVar3;
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&level2.addr_);
  pstore::index::details::internal_node::read_node((internal_node *)&level2_internal,db,tVar4);
  piVar3 = pstore::index::details::internal_node::operator[]
                     (level2_internal.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0);
  level3 = *piVar3;
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&level3.addr_);
  pstore::index::details::internal_node::read_node((internal_node *)&level3_internal,db,tVar4);
  piVar3 = pstore::index::details::internal_node::operator[]
                     (level3_internal.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0);
  level4 = *piVar3;
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&level4.addr_);
  pstore::index::details::internal_node::read_node((internal_node *)&level4_internal,db,tVar4);
  piVar3 = pstore::index::details::internal_node::operator[]
                     (level4_internal.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0);
  level5 = *piVar3;
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&level5.addr_);
  pstore::index::details::internal_node::read_node((internal_node *)&level5_internal,db,tVar4);
  level6_internal.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (level5_internal.
          super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->bitmap_;
  level7_internal.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_4_ = 0x20;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"level5_internal->get_bitmap ()","0b100000U",
             (unsigned_long *)&level6_internal,(uint *)&level7_internal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&level6_internal);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&level7_internal,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x40d,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&level7_internal,(Message *)&level6_internal);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&level7_internal);
    if (level6_internal.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (**(code **)(*(long *)((level6_internal.
                              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->signature_)._M_elems + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  piVar3 = pstore::index::details::internal_node::operator[]
                     (level5_internal.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0);
  level6 = *piVar3;
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&level6.addr_);
  pstore::index::details::internal_node::read_node((internal_node *)&level6_internal,db,tVar4);
  piVar3 = pstore::index::details::internal_node::operator[]
                     (level6_internal.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0);
  level7 = *piVar3;
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&level7.addr_);
  pstore::index::details::internal_node::read_node((internal_node *)&level7_internal,db,tVar4);
  piVar3 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      CONCAT44(level7_internal.
                               super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._4_4_,
                               level7_internal.
                               super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._0_4_),0);
  level8 = *piVar3;
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&level8.addr_);
  pstore::index::details::internal_node::read_node((internal_node *)&level8_internal,db,tVar4);
  piVar3 = pstore::index::details::internal_node::operator[]
                     (level8_internal.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0);
  level9 = *piVar3;
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&level9.addr_);
  pstore::index::details::internal_node::read_node((internal_node *)&level9_internal,db,tVar4);
  piVar3 = pstore::index::details::internal_node::operator[]
                     (level9_internal.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0);
  level10 = *piVar3;
  tVar4 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>((index_pointer *)&level10.addr_)
  ;
  pstore::index::details::internal_node::read_node((internal_node *)&level10_internal,db,tVar4);
  gtest_ar__2._0_8_ =
       (level10_internal.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->bitmap_;
  local_388.data_._0_4_ = 0x9000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"level10_internal->get_bitmap ()","0b10010000\'00000000U",
             (unsigned_long *)&gtest_ar__2,(uint *)&local_388);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x41d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  iVar5.internal_ = (internal_node *)0x0;
  piVar3 = pstore::index::details::internal_node::operator[]
                     (level10_internal.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)piVar3->internal_,iVar5);
  iVar5 = (index_pointer)0x1;
  piVar3 = pstore::index::details::internal_node::operator[]
                     (level10_internal.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,1);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)piVar3->internal_,iVar5);
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&gtest_ar,"e",(allocator *)&local_388);
  bVar2 = anon_unknown.dwarf_13be9a::GenericIndexFixture::is_found
                    ((GenericIndexFixture *)this,ptVar1,(string *)&gtest_ar);
  gtest_ar__2.success_ = bVar2;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&local_388);
    std::operator<<((ostream *)(CONCAT44(local_388.data_._4_4_,local_388.data_._0_4_) + 0x10),
                    "key \"e\" should be present in the index");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,
               (AssertionResult *)"this->is_found (*index_, \"e\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x420,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_340,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(local_388.data_._4_4_,local_388.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_388.data_._4_4_,local_388.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&gtest_ar,"f",(allocator *)&local_388);
  bVar2 = anon_unknown.dwarf_13be9a::GenericIndexFixture::is_found
                    ((GenericIndexFixture *)this,ptVar1,(string *)&gtest_ar);
  gtest_ar__2.success_ = bVar2;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&local_388);
    std::operator<<((ostream *)(CONCAT44(local_388.data_._4_4_,local_388.data_._0_4_) + 0x10),
                    "key \"f\" should be present in the index");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,
               (AssertionResult *)"this->is_found (*index_, \"f\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x421,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_340,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(local_388.data_._4_4_,local_388.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_388.data_._4_4_,local_388.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&level10_internal.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&level9_internal.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&level8_internal.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&level7_internal.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&level6_internal.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&level5_internal.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&level4_internal.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&level3_internal.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&level2_internal.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&level1_internal.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t1);
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LeafLevelTenCollision) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});

    // First insert_or_assign should be very conventional. The result will be a trie whose root
    // points to an address of the "first" string. Second insert_or_assign should trigger the
    // insertion of an additional internal node in the trie. This unit test checks the
    // insert_into_leaf function.
    //
    //              +--------+
    // root_ ->     | 000000 |       (hash bits 0-5)
    //              +--------+
    //                   |
    //                   v
    //              +--------+
    // level1 ->    | 000001 |       (hash bits 6-11)
    //              +--------+
    //                   |
    //                   :
    //                   |
    //                   v
    //              +--------+
    // level9 ->    | 001001 |       (hash bits 54-59)
    //              +--------+
    //                   |
    //                   v
    //           +--------+--------+
    // level10-> | 001100 | 001111 |  (hash bits 60-63)
    //           +--------+--------+
    //                |       |
    //                v       |
    //               "e"      v       (0b1100 001001 001000 000111 000110 000101 000100 000011
    //               000010 000001 000000)
    //                       "f"      (0b1111 001001 001000 000111 000110 000101 000100 000011
    //                       000010 000001 000000)

    this->insert_or_assign (*index_, t1, "e");
    this->insert_or_assign (*index_, t1, "f");

    EXPECT_TRUE (this->is_found (*index_, "e")) << "key \"e\" should be present in the index";
    EXPECT_TRUE (this->is_found (*index_, "f")) << "key \"f\" should be present in the index";
    {
        // Check that the trie was laid out as we expected in the heap.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);
        internal_node const * const root_internal = root.untag<internal_node *> ();
        EXPECT_EQ (root_internal->get_bitmap (), 0b1U);

        auto const level1_internal = (*root_internal)[0].untag<internal_node *> ();
        auto const level2_internal = (*level1_internal)[0].untag<internal_node *> ();
        auto const level3_internal = (*level2_internal)[0].untag<internal_node *> ();
        auto const level4_internal = (*level3_internal)[0].untag<internal_node *> ();
        auto const level5_internal = (*level4_internal)[0].untag<internal_node *> ();
        EXPECT_EQ (level5_internal->get_bitmap (), 0b100000U);

        auto const level6_internal = (*level5_internal)[0].untag<internal_node *> ();
        auto const level7_internal = (*level6_internal)[0].untag<internal_node *> ();
        auto const level8_internal = (*level7_internal)[0].untag<internal_node *> ();
        auto const level9_internal = (*level8_internal)[0].untag<internal_node *> ();
        auto const level10_internal = (*level9_internal)[0].untag<internal_node *> ();
        EXPECT_EQ (level10_internal->get_bitmap (), 0b1001000000000000U);

        this->check_is_leaf_node ((*level10_internal)[0]);
        this->check_is_leaf_node ((*level10_internal)[1]);
        index_->flush (t1, db_.get_current_revision ());
    }
    {
        // Check that the trie was laid out as we expected in the store.
        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);
        auto const root_internal =
            internal_node::read_node (db_, root.untag_address<internal_node> ());
        auto const level1 = (*root_internal)[0];
        auto const level1_internal =
            internal_node::read_node (db_, level1.untag_address<internal_node> ());
        auto const level2 = (*level1_internal)[0];
        auto const level2_internal =
            internal_node::read_node (db_, level2.untag_address<internal_node> ());
        auto const level3 = (*level2_internal)[0];
        auto const level3_internal =
            internal_node::read_node (db_, level3.untag_address<internal_node> ());
        auto const level4 = (*level3_internal)[0];
        auto const level4_internal =
            internal_node::read_node (db_, level4.untag_address<internal_node> ());
        auto const level5 = (*level4_internal)[0];
        auto const level5_internal =
            internal_node::read_node (db_, level5.untag_address<internal_node> ());
        EXPECT_EQ (level5_internal->get_bitmap (), 0b100000U);
        auto const level6 = (*level5_internal)[0];
        auto const level6_internal =
            internal_node::read_node (db_, level6.untag_address<internal_node> ());
        auto const level7 = (*level6_internal)[0];
        auto const level7_internal =
            internal_node::read_node (db_, level7.untag_address<internal_node> ());
        auto const level8 = (*level7_internal)[0];
        auto const level8_internal =
            internal_node::read_node (db_, level8.untag_address<internal_node> ());
        auto const level9 = (*level8_internal)[0];
        auto const level9_internal =
            internal_node::read_node (db_, level9.untag_address<internal_node> ());
        auto const level10 = (*level9_internal)[0];
        auto const level10_internal =
            internal_node::read_node (db_, level10.untag_address<internal_node> ());
        EXPECT_EQ (level10_internal->get_bitmap (), 0b10010000'00000000U);
        this->check_is_leaf_node ((*level10_internal)[0]);
        this->check_is_leaf_node ((*level10_internal)[1]);
        EXPECT_TRUE (this->is_found (*index_, "e")) << "key \"e\" should be present in the index";
        EXPECT_TRUE (this->is_found (*index_, "f")) << "key \"f\" should be present in the index";
    }
}